

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O2

ze_result_t
zetGetCommandListExpProcAddrTable
          (ze_api_version_t version,zet_command_list_exp_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable == (zet_command_list_exp_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      *(zet_pfnCommandListAppendMarkerExp_t *)(validation_layer::context + 0x1c6) =
           pDdiTable->pfnAppendMarkerExp;
      pDdiTable->pfnAppendMarkerExp = validation_layer::zetCommandListAppendMarkerExp;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetCommandListExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_command_list_exp_dditable_t* pDdiTable      ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zetDdiTable.CommandListExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnAppendMarkerExp                          = pDdiTable->pfnAppendMarkerExp;
    pDdiTable->pfnAppendMarkerExp                        = validation_layer::zetCommandListAppendMarkerExp;

    return result;
}